

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_compare_firstGreaterThanSecond_fn(int _i)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  AString string2;
  AString string4;
  AString string3;
  AString string1;
  
  private_ACUtilsTest_AString_constructTestString(&string1,"",8);
  private_ACUtilsTest_AString_constructTestString(&string2,"a",8);
  private_ACUtilsTest_AString_constructTestString(&string3,"b",8);
  private_ACUtilsTest_AString_constructTestString(&string4,"ba",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  iVar1 = AString_compare(&string2,&string1);
  if (iVar1 < 1) {
    string2.size = (size_t)iVar1;
    string4.buffer = "0";
    expr = "Assertion \'_ck_x > _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar5 = "AString_compare(&string2, &string1) > 0";
    pcVar6 = "AString_compare(&string2, &string1)";
    iVar1 = 0x8ef;
    goto LAB_0014a048;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8ef);
  if (string1.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x8f0);
    if (string1.buffer == (char *)0x0) {
      string2.size = 0;
      string4.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar5 = "(void*) (string1).buffer != NULL";
      pcVar6 = "(void*) (string1).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f0);
      if (string1.buffer == (char *)0x0) {
        string1.buffer = "(null)";
        string2.size = 0x16819b;
      }
      else {
        if (*string1.buffer == '\0') {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f0);
          if (string1.size != 0) {
            string4.buffer = "strlen(\"\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string1).size == strlen(\"\")";
            pcVar6 = "(string1).size";
            string2.size = string1.size;
            goto LAB_00149625;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f0);
          if (string2.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8f1);
            if (string2.buffer == (char *)0x0) {
              string2.size = 0;
              string4.buffer = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) (string2).buffer != NULL";
              pcVar6 = "(void*) (string2).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f1);
              if (string2.buffer == (char *)0x0) {
                string2.size = 0x16819b;
                string2.buffer = "(null)";
              }
              else {
                uVar3 = (byte)*string2.buffer - 0x61;
                if (uVar3 == 0) {
                  uVar3 = (uint)(byte)string2.buffer[1];
                }
                if (uVar3 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f1);
                  if (string2.size != 1) {
                    string4.buffer = "strlen(\"a\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(string2).size == strlen(\"a\")";
                    pcVar6 = "(string2).size";
                    goto LAB_00149759;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f1);
                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                    string4.buffer = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                    iVar1 = 0x8f2;
                    string2.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_0014a048;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f2);
                  iVar2 = AString_compare(&string3,&string2);
                  if (iVar2 < 1) {
                    string4.buffer = "0";
                    expr = "Assertion \'_ck_x > _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                    pcVar5 = "AString_compare(&string3, &string2) > 0";
                    pcVar6 = "AString_compare(&string3, &string2)";
                    iVar1 = 0x8f3;
                    string2.size = (size_t)(long)iVar2;
                    goto LAB_0014a048;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f3);
                  if (string2.capacity == 8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x8f4);
                    if (string2.buffer == (char *)0x0) {
                      string2.size = 0;
                      string4.buffer = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar5 = "(void*) (string2).buffer != NULL";
                      pcVar6 = "(void*) (string2).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f4);
                      if (string2.buffer == (char *)0x0) {
                        string2.size = 0x16819b;
                        string2.buffer = "(null)";
                      }
                      else {
                        uVar3 = (byte)*string2.buffer - 0x61;
                        if (uVar3 == 0) {
                          uVar3 = (uint)(byte)string2.buffer[1];
                        }
                        if (uVar3 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f4);
                          if (string2.size != 1) {
                            string4.buffer = "strlen(\"a\")";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(string2).size == strlen(\"a\")";
                            pcVar6 = "(string2).size";
                            goto LAB_00149919;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f4);
                          if (string3.capacity == 8) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x8f5);
                            if (string3.buffer == (char *)0x0) {
                              string3.size = 0;
                              string4.buffer = (char *)0x0;
                              expr = "Assertion \'_ck_x != NULL\' failed";
                              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                              pcVar5 = "(void*) (string3).buffer != NULL";
                              pcVar6 = "(void*) (string3).buffer";
                            }
                            else {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x8f5);
                              if (string3.buffer == (char *)0x0) {
                                string3.size = 0x16819b;
                                string3.buffer = "(null)";
                              }
                              else {
                                uVar3 = (byte)*string3.buffer - 0x62;
                                if (uVar3 == 0) {
                                  uVar3 = (uint)(byte)string3.buffer[1];
                                }
                                if (uVar3 == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8f5);
                                  if (string3.size != 1) {
                                    string4.buffer = "strlen(\"b\")";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "(string3).size == strlen(\"b\")";
                                    pcVar6 = "(string3).size";
                                    goto LAB_00149a4d;
                                  }
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8f5);
                                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                                    string4.buffer = "(0)";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
                                    pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                                    iVar1 = 0x8f6;
                                    string2.size = private_ACUtilsTest_AString_reallocCount;
                                    goto LAB_0014a048;
                                  }
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8f6);
                                  iVar2 = AString_compare(&string4,&string2);
                                  if (iVar2 < 1) {
                                    string4.buffer = "0";
                                    expr = "Assertion \'_ck_x > _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                                    pcVar5 = "AString_compare(&string4, &string2) > 0";
                                    pcVar6 = "AString_compare(&string4, &string2)";
                                    iVar1 = 0x8f7;
                                    string2.size = (size_t)(long)iVar2;
                                    goto LAB_0014a048;
                                  }
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8f7);
                                  if (string2.capacity == 8) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x8f8);
                                    if (string2.buffer == (char *)0x0) {
                                      string2.size = 0;
                                      string4.buffer = (char *)0x0;
                                      expr = "Assertion \'_ck_x != NULL\' failed";
                                      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                      pcVar5 = "(void*) (string2).buffer != NULL";
                                      pcVar6 = "(void*) (string2).buffer";
                                    }
                                    else {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8f8);
                                      if (string2.buffer == (char *)0x0) {
                                        string2.size = 0x16819b;
                                        string2.buffer = "(null)";
                                      }
                                      else {
                                        uVar3 = (byte)*string2.buffer - 0x61;
                                        if (uVar3 == 0) {
                                          uVar3 = (uint)(byte)string2.buffer[1];
                                        }
                                        if (uVar3 == 0) {
                                          _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8f8);
                                          if (string2.size != 1) {
                                            string4.buffer = "strlen(\"a\")";
                                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju"
                                            ;
                                            pcVar5 = "(string2).size == strlen(\"a\")";
                                            pcVar6 = "(string2).size";
                                            goto LAB_00149c0d;
                                          }
                                          _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8f8);
                                          if (string4.capacity == 8) {
                                            _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8f9);
                                            if (string4.buffer == (char *)0x0) {
                                              string4.size = 0;
                                              string4.buffer = (char *)0x0;
                                              expr = "Assertion \'_ck_x != NULL\' failed";
                                              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                              pcVar5 = "(void*) (string4).buffer != NULL";
                                              pcVar6 = "(void*) (string4).buffer";
                                            }
                                            else {
                                              _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8f9);
                                              if (string4.buffer == (char *)0x0) {
                                                string4.size = 0x16819b;
                                                string4.buffer = "(null)";
                                              }
                                              else {
                                                uVar3 = (byte)*string4.buffer - 0x62;
                                                if ((uVar3 == 0) &&
                                                   (uVar3 = (byte)string4.buffer[1] - 0x61,
                                                   uVar3 == 0)) {
                                                  uVar3 = (uint)(byte)string4.buffer[2];
                                                }
                                                if (uVar3 == 0) {
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8f9);
                                                  if (string4.size != 2) {
                                                    string4.buffer = "strlen(\"ba\")";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string4).size == strlen(\"ba\")";
                                                  pcVar6 = "(string4).size";
                                                  goto LAB_00149d48;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8f9);
                                                  if (private_ACUtilsTest_AString_reallocCount != 0)
                                                  {
                                                    string4.buffer = "(0)";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = 
                                                  "private_ACUtilsTest_AString_reallocCount == (0)";
                                                  pcVar6 = 
                                                  "private_ACUtilsTest_AString_reallocCount";
                                                  iVar1 = 0x8fa;
                                                  string2.size = 
                                                  private_ACUtilsTest_AString_reallocCount;
                                                  goto LAB_0014a048;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fa);
                                                  iVar2 = AString_compare(&string4,&string3);
                                                  if (iVar2 < 1) {
                                                    string4.buffer = "0";
                                                    expr = "Assertion \'_ck_x > _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                                                  pcVar5 = "AString_compare(&string4, &string3) > 0"
                                                  ;
                                                  pcVar6 = "AString_compare(&string4, &string3)";
                                                  iVar1 = 0x8fb;
                                                  string2.size = (size_t)(long)iVar2;
                                                  goto LAB_0014a048;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fb);
                                                  if (string3.capacity == 8) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fc);
                                                  if (string3.buffer == (char *)0x0) {
                                                    string3.size = 0;
                                                    string4.buffer = (char *)0x0;
                                                    expr = "Assertion \'_ck_x != NULL\' failed";
                                                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                                    pcVar5 = "(void*) (string3).buffer != NULL";
                                                    pcVar6 = "(void*) (string3).buffer";
                                                  }
                                                  else {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fc);
                                                  if (string3.buffer == (char *)0x0) {
                                                    string3.buffer = "(null)";
                                                    string3.size = 0x16819b;
                                                  }
                                                  else {
                                                    uVar3 = (byte)*string3.buffer - 0x62;
                                                    if (uVar3 == 0) {
                                                      uVar3 = (uint)(byte)string3.buffer[1];
                                                    }
                                                    if (uVar3 == 0) {
                                                      _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fc);
                                                  if (string3.size != 1) {
                                                    string4.buffer = "strlen(\"b\")";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string3).size == strlen(\"b\")";
                                                  pcVar6 = "(string3).size";
                                                  goto LAB_00149f08;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fc);
                                                  if (string4.capacity == 8) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd);
                                                  if (string4.buffer == (char *)0x0) {
                                                    string4.size = 0;
                                                    string4.buffer = (char *)0x0;
                                                    expr = "Assertion \'_ck_x != NULL\' failed";
                                                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                                    pcVar5 = "(void*) (string4).buffer != NULL";
                                                    pcVar6 = "(void*) (string4).buffer";
                                                  }
                                                  else {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd);
                                                  if (string4.buffer == (char *)0x0) {
                                                    string4.buffer = "(null)";
                                                    string4.size = 0x16819b;
                                                  }
                                                  else {
                                                    uVar3 = (byte)*string4.buffer - 0x62;
                                                    if ((uVar3 == 0) &&
                                                       (uVar3 = (byte)string4.buffer[1] - 0x61,
                                                       uVar3 == 0)) {
                                                      uVar3 = (uint)(byte)string4.buffer[2];
                                                    }
                                                    if (uVar3 == 0) {
                                                      _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd);
                                                  if (string4.size == 2) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd);
                                                  if (private_ACUtilsTest_AString_reallocCount == 0)
                                                  {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fe);
                                                  (*string1.deallocator)(string1.buffer);
                                                  (*string2.deallocator)(string2.buffer);
                                                  (*string3.deallocator)(string3.buffer);
                                                  (*string4.deallocator)(string4.buffer);
                                                  return;
                                                  }
                                                  string4.buffer = "(0)";
                                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = 
                                                  "private_ACUtilsTest_AString_reallocCount == (0)";
                                                  pcVar6 = 
                                                  "private_ACUtilsTest_AString_reallocCount";
                                                  iVar1 = 0x8fe;
                                                  string2.size = 
                                                  private_ACUtilsTest_AString_reallocCount;
                                                  goto LAB_0014a048;
                                                  }
                                                  string4.buffer = "strlen(\"ba\")";
                                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string4).size == strlen(\"ba\")";
                                                  pcVar6 = "(string4).size";
                                                  goto LAB_0014a043;
                                                  }
                                                  string4.size = 0x15c553;
                                                  }
                                                  expr = 
                                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                                  ;
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                                  ;
                                                  pcVar5 = "(string4).buffer == (\"ba\")";
                                                  pcVar6 = "(string4).buffer";
                                                  }
                                                  }
                                                  else {
                                                    string4.buffer = "(8)";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string4).capacity == (8)";
                                                  pcVar6 = "(string4).capacity";
                                                  string4.size = string4.capacity;
                                                  }
LAB_0014a043:
                                                  iVar1 = 0x8fd;
                                                  string2.size = string4.size;
                                                  goto LAB_0014a048;
                                                  }
                                                  string3.size = 0x15c553;
                                                  }
                                                  expr = 
                                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                                  ;
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                                  ;
                                                  pcVar5 = "(string3).buffer == (\"b\")";
                                                  pcVar6 = "(string3).buffer";
                                                  string4.buffer = string3.buffer;
                                                  }
                                                  }
                                                  else {
                                                    string4.buffer = "(8)";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string3).capacity == (8)";
                                                  pcVar6 = "(string3).capacity";
                                                  string3.size = string3.capacity;
                                                  }
LAB_00149f08:
                                                  iVar1 = 0x8fc;
                                                  string2.size = string3.size;
                                                  goto LAB_0014a048;
                                                }
                                                string4.size = 0x15c553;
                                              }
                                              expr = 
                                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                              ;
                                              pcVar4 = 
                                              "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                                              pcVar5 = "(string4).buffer == (\"ba\")";
                                              pcVar6 = "(string4).buffer";
                                            }
                                          }
                                          else {
                                            string4.buffer = "(8)";
                                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju"
                                            ;
                                            pcVar5 = "(string4).capacity == (8)";
                                            pcVar6 = "(string4).capacity";
                                            string4.size = string4.capacity;
                                          }
LAB_00149d48:
                                          iVar1 = 0x8f9;
                                          string2.size = string4.size;
                                          goto LAB_0014a048;
                                        }
                                        string2.size = 0x15c553;
                                      }
                                      expr = 
                                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                      ;
                                      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                      ;
                                      pcVar5 = "(string2).buffer == (\"a\")";
                                      pcVar6 = "(string2).buffer";
                                      string4.buffer = string2.buffer;
                                    }
                                  }
                                  else {
                                    string4.buffer = "(8)";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "(string2).capacity == (8)";
                                    pcVar6 = "(string2).capacity";
                                    string2.size = string2.capacity;
                                  }
LAB_00149c0d:
                                  iVar1 = 0x8f8;
                                  goto LAB_0014a048;
                                }
                                string3.size = 0x15c553;
                              }
                              expr = 
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ;
                              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                              pcVar5 = "(string3).buffer == (\"b\")";
                              pcVar6 = "(string3).buffer";
                              string4.buffer = string3.buffer;
                            }
                          }
                          else {
                            string4.buffer = "(8)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(string3).capacity == (8)";
                            pcVar6 = "(string3).capacity";
                            string3.size = string3.capacity;
                          }
LAB_00149a4d:
                          iVar1 = 0x8f5;
                          string2.size = string3.size;
                          goto LAB_0014a048;
                        }
                        string2.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar5 = "(string2).buffer == (\"a\")";
                      pcVar6 = "(string2).buffer";
                      string4.buffer = string2.buffer;
                    }
                  }
                  else {
                    string4.buffer = "(8)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(string2).capacity == (8)";
                    pcVar6 = "(string2).capacity";
                    string2.size = string2.capacity;
                  }
LAB_00149919:
                  iVar1 = 0x8f4;
                  goto LAB_0014a048;
                }
                string2.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(string2).buffer == (\"a\")";
              pcVar6 = "(string2).buffer";
              string4.buffer = string2.buffer;
            }
          }
          else {
            string4.buffer = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string2).capacity == (8)";
            pcVar6 = "(string2).capacity";
            string2.size = string2.capacity;
          }
LAB_00149759:
          iVar1 = 0x8f1;
          goto LAB_0014a048;
        }
        string2.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar5 = "(string1).buffer == (\"\")";
      pcVar6 = "(string1).buffer";
      string4.buffer = string1.buffer;
    }
  }
  else {
    string4.buffer = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = "(string1).capacity == (8)";
    pcVar6 = "(string1).capacity";
    string2.size = string1.capacity;
  }
LAB_00149625:
  iVar1 = 0x8f0;
LAB_0014a048:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar4,pcVar5,pcVar6,string2.size,string4.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_compare_firstGreaterThanSecond)
{
    struct AString string1 = private_ACUtilsTest_AString_constructTestString("", 8);
    struct AString string2 = private_ACUtilsTest_AString_constructTestString("a", 8);
    struct AString string3 = private_ACUtilsTest_AString_constructTestString("b", 8);
    struct AString string4 = private_ACUtilsTest_AString_constructTestString("ba", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string2, &string1), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string1, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string3, &string2), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string4, &string2), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string4, "ba", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string4, &string3), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string4, "ba", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string1);
    private_ACUtilsTest_AString_destructTestString(string2);
    private_ACUtilsTest_AString_destructTestString(string3);
    private_ACUtilsTest_AString_destructTestString(string4);
}